

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::erase
          (QGenericArrayOps<VkSpecParser::Command> *this,Command *b,qsizetype n)

{
  qsizetype *pqVar1;
  Command *pCVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Command *pCVar7;
  
  pCVar7 = b + n;
  pCVar2 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
  if ((pCVar2 == b) &&
     (pCVar7 != pCVar2 + (this->super_QArrayDataPointer<VkSpecParser::Command>).size)) {
    (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr = pCVar7;
  }
  else {
    lVar3 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
    if (pCVar7 != pCVar2 + lVar3) {
      do {
        pDVar4 = (b->cmd).name.d.d;
        pCVar7 = b + n;
        (b->cmd).name.d.d = (pCVar7->cmd).name.d.d;
        (pCVar7->cmd).name.d.d = pDVar4;
        pcVar5 = (b->cmd).name.d.ptr;
        (b->cmd).name.d.ptr = (pCVar7->cmd).name.d.ptr;
        (pCVar7->cmd).name.d.ptr = pcVar5;
        qVar6 = (b->cmd).name.d.size;
        (b->cmd).name.d.size = (pCVar7->cmd).name.d.size;
        (pCVar7->cmd).name.d.size = qVar6;
        pDVar4 = (b->cmd).type.d.d;
        (b->cmd).type.d.d = (pCVar7->cmd).type.d.d;
        (pCVar7->cmd).type.d.d = pDVar4;
        pcVar5 = (b->cmd).type.d.ptr;
        (b->cmd).type.d.ptr = (pCVar7->cmd).type.d.ptr;
        (pCVar7->cmd).type.d.ptr = pcVar5;
        qVar6 = (b->cmd).type.d.size;
        (b->cmd).type.d.size = (pCVar7->cmd).type.d.size;
        (pCVar7->cmd).type.d.size = qVar6;
        pDVar4 = (b->cmd).typeSuffix.d.d;
        (b->cmd).typeSuffix.d.d = (pCVar7->cmd).typeSuffix.d.d;
        (pCVar7->cmd).typeSuffix.d.d = pDVar4;
        pcVar5 = (b->cmd).typeSuffix.d.ptr;
        (b->cmd).typeSuffix.d.ptr = (pCVar7->cmd).typeSuffix.d.ptr;
        (pCVar7->cmd).typeSuffix.d.ptr = pcVar5;
        qVar6 = (b->cmd).typeSuffix.d.size;
        (b->cmd).typeSuffix.d.size = (pCVar7->cmd).typeSuffix.d.size;
        (pCVar7->cmd).typeSuffix.d.size = qVar6;
        QArrayDataPointer<VkSpecParser::TypedName>::operator=(&(b->args).d,&(pCVar7->args).d);
        b->deviceLevel = pCVar7->deviceLevel;
        pCVar7 = b + n + 1;
        b = b + 1;
      } while (pCVar7 != pCVar2 + lVar3);
      pCVar7 = b + n;
    }
  }
  pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).size;
  *pqVar1 = *pqVar1 - n;
  std::_Destroy_aux<false>::__destroy<VkSpecParser::Command*>(b,pCVar7);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }